

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::Tracer_testTracerSpanSelfRefWithOtherRefs_Test::
~Tracer_testTracerSpanSelfRefWithOtherRefs_Test
          (Tracer_testTracerSpanSelfRefWithOtherRefs_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Tracer, testTracerSpanSelfRefWithOtherRefs)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer = std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    {
        const jaegertracing::SpanContext spanSelfContext { {1, 2}, 3, 0, 0, jaegertracing::SpanContext::StrMap() };
        auto spanRoot = tracer->StartSpan("test-root-self-ref", {jaegertracing::SelfRef(&spanSelfContext)});
        ASSERT_TRUE(spanRoot);
        auto jaegerSpanRoot = dynamic_cast<jaegertracing::Span&>(*spanRoot.get());
        ASSERT_EQ(jaegerSpanRoot.context().traceID(), jaegertracing::TraceID(1, 2));
        ASSERT_EQ(jaegerSpanRoot.context().spanID(), 3);

        const jaegertracing::SpanContext spanSelfContext2 { {1, 2}, 4, 0, 0, jaegertracing::SpanContext::StrMap() };
        auto spanChild = tracer->StartSpan("test-child-self-ref",
            { opentracing::ChildOf(&spanRoot->context()), jaegertracing::SelfRef(&spanSelfContext2) }
        );
        ASSERT_FALSE(spanChild);
    }
    tracer->Close();
}